

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauTools.cpp
# Opt level: O0

bool mau::SetCurrentThreadAffinity(uint processorIndex)

{
  int iVar1;
  pthread_t __th;
  uint in_EDI;
  size_t __cpu;
  cpu_set_t cpuset;
  cpu_set_t local_88;
  uint local_4;
  
  local_4 = in_EDI;
  memset(&local_88,0,0x80);
  if (local_4 >> 3 < 0x80) {
    local_88.__bits[local_4 >> 6] = 1L << ((byte)local_4 & 0x3f) | local_88.__bits[local_4 >> 6];
  }
  __th = pthread_self();
  iVar1 = pthread_setaffinity_np(__th,0x80,&local_88);
  return iVar1 == 0;
}

Assistant:

bool SetCurrentThreadAffinity(unsigned processorIndex)
{
#ifdef _WIN32
    return 0 != ::SetThreadAffinityMask(
        ::GetCurrentThread(), (DWORD_PTR)1 << (processorIndex & 63));
#elif !defined(ANDROID)
    cpu_set_t cpuset;
    CPU_ZERO(&cpuset);
    CPU_SET(processorIndex, &cpuset);
    return 0 == pthread_setaffinity_np(pthread_self(),
        sizeof(cpu_set_t), &cpuset);
#else
    return true; // FIXME: Unused on Android anyway
#endif
}